

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

int Abc_NtkDelayTraceCritPath_rec
              (Vec_Int_t *vSlacks,Abc_Obj_t *pNode,Abc_Obj_t *pLeaf,Vec_Int_t *vBest)

{
  float *pfVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pNode_00;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int Fill;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  Abc_Obj_t *pFanin;
  float local_3c;
  
  uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar5 != 2) {
    if (uVar5 == 7) {
      pAVar2 = pNode->pNtk;
      iVar6 = pNode->Id;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,(int)pLeaf);
      if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
LAB_002b4f1f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pAVar3 = pNode->pNtk;
      iVar7 = pAVar3->nTravIds;
      uVar5 = pNode->Id;
      if ((pAVar2->vTravIds).pArray[iVar6] == iVar7) {
        if (((int)uVar5 < 0) || (vBest->nSize <= (int)uVar5)) goto LAB_002b4f1f;
        bVar4 = -1 < vBest->pArray[uVar5];
      }
      else {
        Vec_IntFillExtra(&pAVar3->vTravIds,uVar5 + 1,Fill);
        if (((int)uVar5 < 0) || ((pAVar3->vTravIds).nSize <= (int)uVar5)) {
LAB_002b4f3e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pAVar3->vTravIds).pArray[uVar5] = iVar7;
        if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                        ,0x34f,
                        "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                       );
        }
        if (0 < (pNode->vFanins).nSize) {
          local_3c = 1e+09;
          lVar8 = 0;
          pFanin = (Abc_Obj_t *)0x0;
          do {
            pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
            iVar6 = Abc_NtkDelayTraceCritPath_rec(vSlacks,pNode_00,pLeaf,vBest);
            if (iVar6 != 0) {
              uVar5 = pNode->Id;
              if (pFanin == (Abc_Obj_t *)0x0) {
                if ((int)uVar5 < 0) goto LAB_002b4f1f;
              }
              else {
                if (((int)uVar5 < 0) || (vSlacks->nSize <= (int)uVar5)) goto LAB_002b4f1f;
                uVar10 = (ulong)(uint)vSlacks->pArray[uVar5] + lVar8;
                uVar9 = (uint)uVar10;
                if (((int)uVar9 < 0) || ((uint)vSlacks->nSize <= uVar9)) goto LAB_002b4f1f;
                pfVar1 = (float *)(vSlacks->pArray + (uVar10 & 0xffffffff));
                if (local_3c < *pfVar1 || local_3c == *pfVar1) goto LAB_002b4ed7;
              }
              if (vSlacks->nSize <= (int)uVar5) goto LAB_002b4f1f;
              uVar10 = (ulong)(uint)vSlacks->pArray[uVar5] + lVar8;
              uVar5 = (uint)uVar10;
              if (((int)uVar5 < 0) || ((uint)vSlacks->nSize <= uVar5)) goto LAB_002b4f1f;
              local_3c = (float)vSlacks->pArray[uVar10 & 0xffffffff];
              pFanin = pNode_00;
            }
LAB_002b4ed7:
            lVar8 = lVar8 + 1;
          } while (lVar8 < (pNode->vFanins).nSize);
          if (pFanin != (Abc_Obj_t *)0x0) {
            iVar6 = pNode->Id;
            iVar7 = Abc_NodeFindFanin(pNode,pFanin);
            if ((-1 < (long)iVar6) && (iVar6 < vBest->nSize)) {
              vBest->pArray[iVar6] = iVar7;
              bVar4 = true;
              goto LAB_002b4d4d;
            }
            goto LAB_002b4f3e;
          }
        }
        bVar4 = false;
      }
      goto LAB_002b4d4d;
    }
    if (uVar5 != 5) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x349,
                    "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                   );
    }
  }
  bVar4 = pLeaf == pNode || pLeaf == (Abc_Obj_t *)0x0;
LAB_002b4d4d:
  return (int)bVar4;
}

Assistant:

int Abc_NtkDelayTraceCritPath_rec( Vec_Int_t * vSlacks, Abc_Obj_t * pNode, Abc_Obj_t * pLeaf, Vec_Int_t * vBest )
{
    Abc_Obj_t * pFanin, * pFaninBest = NULL;
    float SlackMin = ABC_INFINITY;  int i;
    // check primary inputs
    if ( Abc_ObjIsCi(pNode) )
        return (pLeaf == NULL || pLeaf == pNode);
    assert( Abc_ObjIsNode(pNode) );
    // check visited
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return Vec_IntEntry(vBest, Abc_ObjId(pNode)) >= 0;
    Abc_NodeSetTravIdCurrent( pNode );
    // check the node
    assert( Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, pFanin, pLeaf, vBest ) )
            continue;
        if ( pFaninBest == NULL || SlackMin > Abc_NtkDelayTraceSlack(vSlacks, pNode, i) )
        {
            pFaninBest = pFanin;
            SlackMin = Abc_NtkDelayTraceSlack(vSlacks, pNode, i);
        }
    }
    if ( pFaninBest != NULL )
        Vec_IntWriteEntry( vBest, Abc_ObjId(pNode), Abc_NodeFindFanin(pNode, pFaninBest) );
    return (pFaninBest != NULL);
}